

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O0

double __thiscall Lesson::score(Lesson *this,double avg_score)

{
  double dVar1;
  initializer_list<double> __l;
  pointer pdVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  float fVar7;
  undefined1 auVar8 [16];
  int local_ac;
  int i;
  double location_score;
  allocator<double> local_89;
  double local_88 [8];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> a;
  double professor_score;
  double avg_score_local;
  Lesson *this_local;
  
  a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88[6] = 0.1;
  local_88[4] = 0.2;
  local_88[5] = 0.1;
  local_88[2] = 0.3;
  local_88[3] = 0.2;
  local_88[0] = 0.1;
  local_88[1] = 0.4;
  local_48 = local_88;
  local_40 = 7;
  std::allocator<double>::allocator(&local_89);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,__l,&local_89);
  std::allocator<double>::~allocator(&local_89);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,this->lesson_id % 7);
  dVar1 = *pvVar4;
  bVar3 = std::vector<Professor,_std::allocator<Professor>_>::empty(&this->prep_list);
  if (bVar3) {
    a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(avg_score / 5.0 +
                  (double)a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  else {
    local_ac = 0;
    while( true ) {
      sVar5 = std::vector<Professor,_std::allocator<Professor>_>::size(&this->prep_list);
      pdVar2 = a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
      if (sVar5 <= (ulong)(long)local_ac) break;
      pvVar6 = std::vector<Professor,_std::allocator<Professor>_>::operator[]
                         (&this->prep_list,(long)local_ac);
      a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(pvVar6->total / 5.0 +
                    (double)a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      local_ac = local_ac + 1;
    }
    sVar5 = std::vector<Professor,_std::allocator<Professor>_>::size(&this->prep_list);
    auVar8._8_4_ = (int)(sVar5 >> 0x20);
    auVar8._0_8_ = sVar5;
    auVar8._12_4_ = 0x45300000;
    a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((double)pdVar2 /
                  ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
  }
  fVar7 = roundf((float)(((double)a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + dVar1) * 1000.0));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return (double)(fVar7 / 1000.0);
}

Assistant:

double Lesson::score(double avg_score)
{
    double professor_score = 0;
    std::vector <double> a = {0.1, 0.4, 0.3, 0.2, 0.2, 0.1, 0.1};
    double location_score = a[lesson_id%7];
    if (!prep_list.empty()) {
        for(int i = 0; i < prep_list.size(); i++){
            professor_score+= double(prep_list[i].total)/5;
        }
        professor_score = professor_score/prep_list.size();
    }
    else {
        professor_score+= double(avg_score)/5;
    }

    return roundf((professor_score + location_score) * 1000 )/ 1000;
}